

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ExprSynonymList(Fts5ExprTerm *pTerm,i64 iRowid,Fts5Buffer *pBuf,u8 **pa,int *pn)

{
  long lVar1;
  Fts5IndexIter *pFVar2;
  int iVar3;
  int iVar4;
  Fts5PoslistReader *pFVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  Fts5PoslistReader *p;
  long iPos;
  ulong uVar9;
  long in_FS_OFFSET;
  bool bVar10;
  Fts5PoslistWriter writer;
  Fts5PoslistReader aStatic [4];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  aStatic[3]._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  aStatic[3].iPos = (i64)&DAT_aaaaaaaaaaaaaaaa;
  aStatic[3].a = &DAT_aaaaaaaaaaaaaaaa;
  aStatic[3]._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  aStatic[2]._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  aStatic[2].iPos = (i64)&DAT_aaaaaaaaaaaaaaaa;
  aStatic[2].a = &DAT_aaaaaaaaaaaaaaaa;
  aStatic[2]._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  aStatic[1]._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  aStatic[1].iPos = (i64)&DAT_aaaaaaaaaaaaaaaa;
  aStatic[1].a = &DAT_aaaaaaaaaaaaaaaa;
  aStatic[1]._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  aStatic[0]._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  aStatic[0].iPos = (i64)&DAT_aaaaaaaaaaaaaaaa;
  aStatic[0].a = &DAT_aaaaaaaaaaaaaaaa;
  aStatic[0]._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  uVar8 = 0;
  iVar4 = 4;
  p = aStatic;
  for (; iVar3 = (int)uVar8, pTerm != (Fts5ExprTerm *)0x0; pTerm = pTerm->pSynonym) {
    pFVar2 = pTerm->pIter;
    pFVar5 = p;
    if (((pFVar2->bEof == '\0') && (pFVar2->iRowid == iRowid)) && (pFVar2->nData != 0)) {
      if (iVar3 == iVar4) {
        pFVar5 = (Fts5PoslistReader *)sqlite3_malloc64((long)iVar4 << 6);
        if (pFVar5 == (Fts5PoslistReader *)0x0) {
          iVar4 = 7;
          goto LAB_001c6782;
        }
        memcpy(pFVar5,p,(long)iVar4 << 5);
        iVar4 = iVar4 * 2;
        if (p != aStatic) {
          sqlite3_free(p);
        }
      }
      sqlite3Fts5PoslistReaderInit(pFVar2->pData,pFVar2->nData,pFVar5 + iVar3);
      uVar8 = (ulong)(iVar3 + 1);
    }
    p = pFVar5;
  }
  if (iVar3 != 1) {
    writer.iPrev = 0;
    pBuf->n = 0;
    iVar4 = 0;
    if (iVar3 < 1) {
      uVar8 = 0;
    }
    lVar7 = -1;
    do {
      iPos = 0x7fffffffffffffff;
      pFVar5 = p;
      uVar9 = uVar8;
      while (bVar10 = uVar9 != 0, uVar9 = uVar9 - 1, bVar10) {
        if (pFVar5->bEof == '\0') {
          lVar6 = pFVar5->iPos;
          if (lVar6 == lVar7) {
            iVar3 = sqlite3Fts5PoslistReaderNext(pFVar5);
            if (iVar3 != 0) goto LAB_001c6720;
            lVar6 = pFVar5->iPos;
          }
          if (lVar6 < iPos) {
            iPos = lVar6;
          }
        }
LAB_001c6720:
        pFVar5 = pFVar5 + 1;
      }
      if ((iPos == 0x7fffffffffffffff) || (iVar4 != 0)) goto LAB_001c6757;
      iVar4 = sqlite3Fts5PoslistWriterAppend(pBuf,&writer,iPos);
      lVar7 = iPos;
    } while( true );
  }
  *pa = p->a;
  *pn = p->n;
  iVar4 = 0;
LAB_001c6782:
  if (p != aStatic) {
    sqlite3_free(p);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar4;
LAB_001c6757:
  if (iVar4 == 0) {
    *pa = pBuf->p;
    *pn = pBuf->n;
  }
  goto LAB_001c6782;
}

Assistant:

static int fts5ExprSynonymList(
  Fts5ExprTerm *pTerm,
  i64 iRowid,
  Fts5Buffer *pBuf,               /* Use this buffer for space if required */
  u8 **pa, int *pn
){
  Fts5PoslistReader aStatic[4];
  Fts5PoslistReader *aIter = aStatic;
  int nIter = 0;
  int nAlloc = 4;
  int rc = SQLITE_OK;
  Fts5ExprTerm *p;

  assert( pTerm->pSynonym );
  for(p=pTerm; p; p=p->pSynonym){
    Fts5IndexIter *pIter = p->pIter;
    if( sqlite3Fts5IterEof(pIter)==0 && pIter->iRowid==iRowid ){
      if( pIter->nData==0 ) continue;
      if( nIter==nAlloc ){
        sqlite3_int64 nByte = sizeof(Fts5PoslistReader) * nAlloc * 2;
        Fts5PoslistReader *aNew = (Fts5PoslistReader*)sqlite3_malloc64(nByte);
        if( aNew==0 ){
          rc = SQLITE_NOMEM;
          goto synonym_poslist_out;
        }
        memcpy(aNew, aIter, sizeof(Fts5PoslistReader) * nIter);
        nAlloc = nAlloc*2;
        if( aIter!=aStatic ) sqlite3_free(aIter);
        aIter = aNew;
      }
      sqlite3Fts5PoslistReaderInit(pIter->pData, pIter->nData, &aIter[nIter]);
      assert( aIter[nIter].bEof==0 );
      nIter++;
    }
  }

  if( nIter==1 ){
    *pa = (u8*)aIter[0].a;
    *pn = aIter[0].n;
  }else{
    Fts5PoslistWriter writer = {0};
    i64 iPrev = -1;
    fts5BufferZero(pBuf);
    while( 1 ){
      int i;
      i64 iMin = FTS5_LARGEST_INT64;
      for(i=0; i<nIter; i++){
        if( aIter[i].bEof==0 ){
          if( aIter[i].iPos==iPrev ){
            if( sqlite3Fts5PoslistReaderNext(&aIter[i]) ) continue;
          }
          if( aIter[i].iPos<iMin ){
            iMin = aIter[i].iPos;
          }
        }
      }
      if( iMin==FTS5_LARGEST_INT64 || rc!=SQLITE_OK ) break;
      rc = sqlite3Fts5PoslistWriterAppend(pBuf, &writer, iMin);
      iPrev = iMin;
    }
    if( rc==SQLITE_OK ){
      *pa = pBuf->p;
      *pn = pBuf->n;
    }
  }

 synonym_poslist_out:
  if( aIter!=aStatic ) sqlite3_free(aIter);
  return rc;
}